

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SelectPoller.cpp
# Opt level: O0

void __thiscall
sznet::net::SelectPoller::fillActiveChannels
          (SelectPoller *this,int numEvents,ChannelList *activeChannels)

{
  ulong uVar1;
  bool bVar2;
  sz_fd sVar3;
  pointer pEVar4;
  pointer ppVar5;
  Channel *local_50;
  Channel *channel;
  _Self local_40;
  const_iterator ch;
  const_iterator cStack_30;
  uint revents;
  __normal_iterator<const_sznet::net::Channel::Event_t_*,_std::vector<sznet::net::Channel::Event_t,_std::allocator<sznet::net::Channel::Event_t>_>_>
  local_28;
  const_iterator it;
  ChannelList *activeChannels_local;
  int numEvents_local;
  SelectPoller *this_local;
  
  it._M_current = (Event_t *)activeChannels;
  local_28._M_current =
       (Event_t *)
       std::vector<sznet::net::Channel::Event_t,_std::allocator<sznet::net::Channel::Event_t>_>::
       begin(&this->m_pollfds);
  activeChannels_local._4_4_ = numEvents;
  do {
    cStack_30 = std::
                vector<sznet::net::Channel::Event_t,_std::allocator<sznet::net::Channel::Event_t>_>
                ::end(&this->m_pollfds);
    bVar2 = __gnu_cxx::operator!=(&local_28,&stack0xffffffffffffffd0);
    if (!bVar2 || activeChannels_local._4_4_ < 1) {
      return;
    }
    ch._M_node._4_4_ = 0;
    pEVar4 = __gnu_cxx::
             __normal_iterator<const_sznet::net::Channel::Event_t_*,_std::vector<sznet::net::Channel::Event_t,_std::allocator<sznet::net::Channel::Event_t>_>_>
             ::operator->(&local_28);
    uVar1 = (this->m_rfds).fds_bits[pEVar4->fd / 0x40];
    pEVar4 = __gnu_cxx::
             __normal_iterator<const_sznet::net::Channel::Event_t_*,_std::vector<sznet::net::Channel::Event_t,_std::allocator<sznet::net::Channel::Event_t>_>_>
             ::operator->(&local_28);
    if ((uVar1 & 1L << ((byte)((long)pEVar4->fd % 0x40) & 0x3f)) != 0) {
      ch._M_node._4_4_ = ch._M_node._4_4_ | 1;
    }
    pEVar4 = __gnu_cxx::
             __normal_iterator<const_sznet::net::Channel::Event_t_*,_std::vector<sznet::net::Channel::Event_t,_std::allocator<sznet::net::Channel::Event_t>_>_>
             ::operator->(&local_28);
    uVar1 = (this->m_wfds).fds_bits[pEVar4->fd / 0x40];
    pEVar4 = __gnu_cxx::
             __normal_iterator<const_sznet::net::Channel::Event_t_*,_std::vector<sznet::net::Channel::Event_t,_std::allocator<sznet::net::Channel::Event_t>_>_>
             ::operator->(&local_28);
    if ((uVar1 & 1L << ((byte)((long)pEVar4->fd % 0x40) & 0x3f)) != 0) {
      ch._M_node._4_4_ = ch._M_node._4_4_ | 8;
    }
    pEVar4 = __gnu_cxx::
             __normal_iterator<const_sznet::net::Channel::Event_t_*,_std::vector<sznet::net::Channel::Event_t,_std::allocator<sznet::net::Channel::Event_t>_>_>
             ::operator->(&local_28);
    uVar1 = (this->m_efds).fds_bits[pEVar4->fd / 0x40];
    pEVar4 = __gnu_cxx::
             __normal_iterator<const_sznet::net::Channel::Event_t_*,_std::vector<sznet::net::Channel::Event_t,_std::allocator<sznet::net::Channel::Event_t>_>_>
             ::operator->(&local_28);
    if ((uVar1 & 1L << ((byte)((long)pEVar4->fd % 0x40) & 0x3f)) != 0) {
      ch._M_node._4_4_ = ch._M_node._4_4_ | 0x10;
    }
    if (ch._M_node._4_4_ != 0) {
      activeChannels_local._4_4_ = activeChannels_local._4_4_ + -1;
      pEVar4 = __gnu_cxx::
               __normal_iterator<const_sznet::net::Channel::Event_t_*,_std::vector<sznet::net::Channel::Event_t,_std::allocator<sznet::net::Channel::Event_t>_>_>
               ::operator->(&local_28);
      local_40._M_node =
           (_Base_ptr)
           std::
           map<int,_sznet::net::Channel_*,_std::less<int>,_std::allocator<std::pair<const_int,_sznet::net::Channel_*>_>_>
           ::find(&(this->super_Poller).m_channels,&pEVar4->fd);
      channel = (Channel *)
                std::
                map<int,_sznet::net::Channel_*,_std::less<int>,_std::allocator<std::pair<const_int,_sznet::net::Channel_*>_>_>
                ::end(&(this->super_Poller).m_channels);
      bVar2 = std::operator!=(&local_40,(_Self *)&channel);
      if (!bVar2) {
        __assert_fail("ch != m_channels.end()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/sznet/net/SelectPoller.cpp"
                      ,100,
                      "void sznet::net::SelectPoller::fillActiveChannels(int, ChannelList *) const")
        ;
      }
      ppVar5 = std::_Rb_tree_const_iterator<std::pair<const_int,_sznet::net::Channel_*>_>::
               operator->(&local_40);
      local_50 = ppVar5->second;
      sVar3 = Channel::fd(local_50);
      pEVar4 = __gnu_cxx::
               __normal_iterator<const_sznet::net::Channel::Event_t_*,_std::vector<sznet::net::Channel::Event_t,_std::allocator<sznet::net::Channel::Event_t>_>_>
               ::operator->(&local_28);
      if (sVar3 != pEVar4->fd) {
        __assert_fail("channel->fd() == it->fd",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/sznet/net/SelectPoller.cpp"
                      ,0x66,
                      "void sznet::net::SelectPoller::fillActiveChannels(int, ChannelList *) const")
        ;
      }
      Channel::set_revents(local_50,ch._M_node._4_4_);
      std::vector<sznet::net::Channel_*,_std::allocator<sznet::net::Channel_*>_>::push_back
                ((vector<sznet::net::Channel_*,_std::allocator<sznet::net::Channel_*>_> *)
                 it._M_current,&local_50);
    }
    __gnu_cxx::
    __normal_iterator<const_sznet::net::Channel::Event_t_*,_std::vector<sznet::net::Channel::Event_t,_std::allocator<sznet::net::Channel::Event_t>_>_>
    ::operator++(&local_28);
  } while( true );
}

Assistant:

void SelectPoller::fillActiveChannels(int numEvents, ChannelList* activeChannels) const
{
	for (auto it = m_pollfds.begin(); it != m_pollfds.end() && numEvents > 0; ++it)
	{
		unsigned int revents = 0;
		if (FD_ISSET(it->fd, &m_rfds))
		{
			revents |= Channel::kReadEvent;
		}
		if (FD_ISSET(it->fd, &m_wfds))
		{
			revents |= Channel::kWriteEvent;
		}
		if (FD_ISSET(it->fd, &m_efds))
		{
			revents |= Channel::kErrorEvent;
		}
		if (revents > 0)
		{
			--numEvents;
			ChannelMap::const_iterator ch = m_channels.find(it->fd);
			assert(ch != m_channels.end());
			Channel* channel = ch->second;
			assert(channel->fd() == it->fd);
			channel->set_revents(revents);
			activeChannels->push_back(channel);
		}
	}
}